

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_272f4d1::Mse16xHTest_RefMseExtreme_Test::TestBody
          (Mse16xHTest_RefMseExtreme_Test *this)

{
  ACMRandom *this_00;
  int dstride;
  undefined8 *puVar1;
  uint32_t uVar2;
  pointer *__ptr;
  SEARCH_METHODS *message;
  int iVar3;
  long lVar4;
  undefined2 in_FPUControlWord;
  undefined2 in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  uint64_t mse_mod;
  uint64_t mse_ref;
  RegisterStateCheckMMX reg_check_mmx;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  int local_6c;
  unsigned_long local_68;
  unsigned_long local_60;
  internal local_58 [8];
  undefined2 local_50;
  undefined2 uStack_4e;
  undefined4 uStack_4c;
  undefined2 uStack_48;
  AssertHelper local_38;
  
  iVar3 = 0;
  local_60 = 0;
  local_68 = 0;
  dstride = (this->super_Mse16xHTest).params_.width;
  local_6c = (this->super_Mse16xHTest).params_.height;
  this_00 = &(this->super_Mse16xHTest).rnd_;
  do {
    if (0 < (this->super_Mse16xHTest).mem_size) {
      lVar4 = 0;
      do {
        uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
        (this->super_Mse16xHTest).dst_[lVar4] = ((uVar2 >> 0x17 & 1) != 0) + 0xff;
        uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
        (this->super_Mse16xHTest).src_[lVar4] = (ushort)(~uVar2 >> 9) & 0x4000;
        lVar4 = lVar4 + 1;
      } while (lVar4 < (this->super_Mse16xHTest).mem_size);
    }
    uStack_4c = (undefined4)in_FPUInstructionPointer;
    uStack_48 = (undefined2)((ulong)in_FPUInstructionPointer >> 0x20);
    local_60 = aom_mse_16xh_16bit_c
                         ((this->super_Mse16xHTest).dst_,dstride,(this->super_Mse16xHTest).src_,
                          dstride,local_6c);
    libaom_test::RegisterStateCheckMMX::Check((RegisterStateCheckMMX *)local_58);
    local_58[0] = SUB21(in_FPUControlWord,0);
    uStack_4c = (undefined4)in_FPUInstructionPointer;
    uStack_48 = (undefined2)((ulong)in_FPUInstructionPointer >> 0x20);
    local_50 = in_FPUTagWord;
    local_68 = (*(this->super_Mse16xHTest).params_.func)
                         ((this->super_Mse16xHTest).dst_,dstride,(this->super_Mse16xHTest).src_,
                          dstride,local_6c);
    libaom_test::RegisterStateCheckMMX::Check((RegisterStateCheckMMX *)local_58);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              (local_58,"mse_ref","mse_mod",&local_60,&local_68);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_78);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_78._M_head_impl + 0x10),"ref mse: ",9);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_78._M_head_impl + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_78._M_head_impl + 0x10)," mod mse: ",10);
      std::ostream::_M_insert<unsigned_long>((ulong)(local_78._M_head_impl + 0x10));
      puVar1 = (undefined8 *)CONCAT44(uStack_4c,CONCAT22(uStack_4e,local_50));
      message = "";
      if (puVar1 != (undefined8 *)0x0) {
        message = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                 ,0x250,(char *)message);
      testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      if (local_78._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_78._M_head_impl + 8))();
      }
    }
    puVar1 = (undefined8 *)CONCAT44(uStack_4c,CONCAT22(uStack_4e,local_50));
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 10);
  return;
}

Assistant:

TEST_P(Mse16xHTest, RefMseExtreme) { RefMatchExtremeTestMse(); }